

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshglob.c
# Opt level: O3

FT_Error psh_globals_new(FT_Memory memory,T1_Private *priv,PSH_Globals *aglobals)

{
  byte bVar1;
  ushort uVar2;
  PSH_Globals pPVar3;
  FT_Long FVar4;
  ushort uVar5;
  PSH_WidthRec *pPVar6;
  ulong uVar7;
  long lVar8;
  FT_Error error;
  int local_2c;
  
  pPVar3 = (PSH_Globals)ft_mem_qalloc(memory,0xf70,&local_2c);
  if (local_2c == 0) {
    pPVar3->memory = memory;
    pPVar3->dimension[1].stdw.widths[0].org = (uint)priv->standard_width[0];
    bVar1 = priv->num_snap_widths;
    if (bVar1 != 0) {
      pPVar6 = pPVar3->dimension[1].stdw.widths;
      lVar8 = 0;
      do {
        pPVar6 = pPVar6 + 1;
        pPVar6->org = (int)priv->snap_widths[lVar8];
        lVar8 = lVar8 + 1;
      } while ((uint)bVar1 != (uint)lVar8);
    }
    pPVar3->dimension[1].stdw.count = bVar1 + 1;
    pPVar3->dimension[0].stdw.widths[0].org = (uint)priv->standard_height[0];
    bVar1 = priv->num_snap_heights;
    if (bVar1 != 0) {
      pPVar6 = pPVar3->dimension[0].stdw.widths;
      lVar8 = 0;
      do {
        pPVar6 = pPVar6 + 1;
        pPVar6->org = (int)priv->snap_heights[lVar8];
        lVar8 = lVar8 + 1;
      } while ((uint)bVar1 != (uint)lVar8);
    }
    pPVar3->dimension[0].stdw.count = bVar1 + 1;
    psh_blues_set_zones(&pPVar3->blues,(uint)priv->num_blue_values,priv->blue_values,
                        (uint)priv->num_other_blues,priv->other_blues,priv->blue_fuzz,0);
    psh_blues_set_zones(&pPVar3->blues,(uint)priv->num_family_blues,priv->family_blues,
                        (uint)priv->num_family_other_blues,priv->family_other_blues,priv->blue_fuzz,
                        1);
    if ((ulong)priv->num_blue_values == 0) {
      uVar2 = 1;
    }
    else {
      uVar7 = 0;
      uVar5 = 1;
      do {
        uVar2 = priv->blue_values[uVar7 + 1] - priv->blue_values[uVar7];
        if ((short)uVar2 <= (short)uVar5) {
          uVar2 = uVar5;
        }
        uVar7 = uVar7 + 2;
        uVar5 = uVar2;
      } while (uVar7 < priv->num_blue_values);
    }
    if ((ulong)priv->num_other_blues != 0) {
      uVar7 = 0;
      do {
        uVar5 = priv->other_blues[uVar7 + 1] - priv->other_blues[uVar7];
        if ((short)uVar5 <= (short)uVar2) {
          uVar5 = uVar2;
        }
        uVar2 = uVar5;
        uVar7 = uVar7 + 2;
      } while (uVar7 < priv->num_other_blues);
    }
    if ((ulong)priv->num_family_blues != 0) {
      uVar7 = 0;
      do {
        uVar5 = priv->family_blues[uVar7 + 1] - priv->family_blues[uVar7];
        if ((short)uVar5 <= (short)uVar2) {
          uVar5 = uVar2;
        }
        uVar2 = uVar5;
        uVar7 = uVar7 + 2;
      } while (uVar7 < priv->num_family_blues);
    }
    if ((ulong)priv->num_family_other_blues != 0) {
      uVar7 = 0;
      do {
        uVar5 = priv->family_other_blues[uVar7 + 1] - priv->family_other_blues[uVar7];
        if ((short)uVar5 <= (short)uVar2) {
          uVar5 = uVar2;
        }
        uVar2 = uVar5;
        uVar7 = uVar7 + 2;
      } while (uVar7 < priv->num_family_other_blues);
    }
    FVar4 = FT_DivFix(1000,(ulong)uVar2);
    if (priv->blue_scale < FVar4) {
      FVar4 = priv->blue_scale;
    }
    (pPVar3->blues).blue_scale = FVar4;
    (pPVar3->blues).blue_shift = priv->blue_shift;
    (pPVar3->blues).blue_fuzz = priv->blue_fuzz;
    pPVar3->dimension[0].scale_mult = 0;
    pPVar3->dimension[0].scale_delta = 0;
    pPVar3->dimension[1].scale_mult = 0;
    pPVar3->dimension[1].scale_delta = 0;
  }
  *aglobals = pPVar3;
  return local_2c;
}

Assistant:

static FT_Error
  psh_globals_new( FT_Memory     memory,
                   T1_Private*   priv,
                   PSH_Globals  *aglobals )
  {
    PSH_Globals  globals = NULL;
    FT_Error     error;


    if ( !FT_QNEW( globals ) )
    {
      FT_UInt    count;
      FT_Short*  read;


      globals->memory = memory;

      /* copy standard widths */
      {
        PSH_Dimension  dim   = &globals->dimension[1];
        PSH_Width      write = dim->stdw.widths;


        write->org = priv->standard_width[0];
        write++;

        read = priv->snap_widths;
        for ( count = priv->num_snap_widths; count > 0; count-- )
        {
          write->org = *read;
          write++;
          read++;
        }

        dim->stdw.count = priv->num_snap_widths + 1;
      }

      /* copy standard heights */
      {
        PSH_Dimension  dim = &globals->dimension[0];
        PSH_Width      write = dim->stdw.widths;


        write->org = priv->standard_height[0];
        write++;
        read = priv->snap_heights;
        for ( count = priv->num_snap_heights; count > 0; count-- )
        {
          write->org = *read;
          write++;
          read++;
        }

        dim->stdw.count = priv->num_snap_heights + 1;
      }

      /* copy blue zones */
      psh_blues_set_zones( &globals->blues, priv->num_blue_values,
                           priv->blue_values, priv->num_other_blues,
                           priv->other_blues, priv->blue_fuzz, 0 );

      psh_blues_set_zones( &globals->blues, priv->num_family_blues,
                           priv->family_blues, priv->num_family_other_blues,
                           priv->family_other_blues, priv->blue_fuzz, 1 );

      /* limit the BlueScale value to `1 / max_of_blue_zone_heights' */
      {
        FT_Fixed  max_scale;
        FT_Short  max_height = 1;


        max_height = psh_calc_max_height( priv->num_blue_values,
                                          priv->blue_values,
                                          max_height );
        max_height = psh_calc_max_height( priv->num_other_blues,
                                          priv->other_blues,
                                          max_height );
        max_height = psh_calc_max_height( priv->num_family_blues,
                                          priv->family_blues,
                                          max_height );
        max_height = psh_calc_max_height( priv->num_family_other_blues,
                                          priv->family_other_blues,
                                          max_height );

        /* BlueScale is scaled 1000 times */
        max_scale = FT_DivFix( 1000, max_height );
        globals->blues.blue_scale = priv->blue_scale < max_scale
                                      ? priv->blue_scale
                                      : max_scale;
      }

      globals->blues.blue_shift = priv->blue_shift;
      globals->blues.blue_fuzz  = priv->blue_fuzz;

      globals->dimension[0].scale_mult  = 0;
      globals->dimension[0].scale_delta = 0;
      globals->dimension[1].scale_mult  = 0;
      globals->dimension[1].scale_delta = 0;

#ifdef DEBUG_HINTER
      ps_debug_globals = globals;
#endif
    }

    *aglobals = globals;
    return error;
  }